

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O3

void __thiscall antlr::Parser::Parser(Parser *this,TokenBuffer *input)

{
  ParserInputState *pPVar1;
  Ref *pRVar2;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_00241ac0;
  pPVar1 = (ParserInputState *)operator_new(0x40);
  pPVar1->_vptr_ParserInputState = (_func_int **)&PTR__ParserInputState_002418f0;
  pPVar1->guessing = 0;
  (pPVar1->filename)._M_dataplus._M_p = (pointer)&(pPVar1->filename).field_2;
  (pPVar1->filename)._M_string_length = 0;
  (pPVar1->filename).field_2._M_local_buf[0] = '\0';
  pPVar1->input = input;
  pPVar1->inputResponsible = true;
  pRVar2 = (Ref *)operator_new(0x10);
  pRVar2->ptr = pPVar1;
  pRVar2->count = 1;
  (this->inputState).ref = pRVar2;
  this->astFactory = (ASTFactory *)0x0;
  this->traceDepth = 0;
  return;
}

Assistant:

Parser(TokenBuffer* input)
	: inputState(new ParserInputState(input)), astFactory(0), traceDepth(0)
	{
	}